

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

Gia_Man_t * Ifn_ManStrFindModel(Ifn_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *__s;
  Gia_Man_t *p_00;
  char *pcVar6;
  int *piVar7;
  Gia_Man_t *p_01;
  int local_458;
  int nMints;
  int pVarsData [256];
  int local_50;
  int Step;
  int n;
  int iFanin;
  int *pFans;
  int nFans;
  int Type;
  int *pVarMap;
  int local_28;
  int iLit;
  int k;
  int i;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Ifn_Ntk_t *p_local;
  
  __s = malloc((long)p->nParsVIni << 2);
  memset(__s,0xff,(long)p->nParsVIni << 2);
  p_00 = Gia_ManStart(1000);
  pcVar6 = Abc_UtilStrsav("model");
  p_00->pName = pcVar6;
  Gia_ManHashStart(p_00);
  for (iLit = 0; iLit < p->nInps; iLit = iLit + 1) {
    iVar2 = Gia_ManAppendCi(p_00);
    *(int *)((long)__s + (long)iLit * 4) = iVar2;
  }
  for (iLit = p->nObjs; iLit < p->nParsVIni; iLit = iLit + 1) {
    iVar2 = Gia_ManAppendCi(p_00);
    *(int *)((long)__s + (long)iLit * 4) = iVar2;
  }
  iLit = p->nInps;
  do {
    if (p->nObjs <= iLit) {
      Gia_ManAppendCo(p_00,*(int *)((long)__s + (long)(p->nObjs + -1) * 4));
      if (__s != (void *)0x0) {
        free(__s);
      }
      p_01 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      iVar2 = Gia_ManPiNum(p_01);
      if (iVar2 == p->nParsVIni - (p->nObjs - p->nInps)) {
        iVar2 = Gia_ManPoNum(p_01);
        if (iVar2 == 1) {
          return p_01;
        }
        __assert_fail("Gia_ManPoNum(pNew) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x220,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      __assert_fail("Gia_ManPiNum(pNew) == p->nParsVIni - (p->nObjs - p->nInps)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                    ,0x21f,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
    }
    uVar3 = *(uint *)(p->Nodes + iLit) & 7;
    uVar4 = *(uint *)(p->Nodes + iLit) >> 3 & 0x1f;
    piVar7 = p->Nodes[iLit].Fanins;
    uVar1 = *(uint *)(p->Nodes + iLit);
    if (uVar3 == 3) {
      pVarMap._4_4_ = 1;
      for (local_28 = 0; local_28 < (int)uVar4; local_28 = local_28 + 1) {
        pVarMap._4_4_ =
             Gia_ManHashAnd(p_00,pVarMap._4_4_,*(int *)((long)__s + (long)piVar7[local_28] * 4));
      }
      *(int *)((long)__s + (long)iLit * 4) = pVarMap._4_4_;
    }
    else if (uVar3 == 4) {
      pVarMap._4_4_ = 0;
      for (local_28 = 0; local_28 < (int)uVar4; local_28 = local_28 + 1) {
        pVarMap._4_4_ =
             Gia_ManHashXor(p_00,pVarMap._4_4_,*(int *)((long)__s + (long)piVar7[local_28] * 4));
      }
      *(int *)((long)__s + (long)iLit * 4) = pVarMap._4_4_;
    }
    else if (uVar3 == 5) {
      if (uVar4 != 3) {
        __assert_fail("nFans == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x209,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      iVar2 = Gia_ManHashMux(p_00,*(int *)((long)__s + (long)*piVar7 * 4),
                             *(int *)((long)__s + (long)p->Nodes[iLit].Fanins[1] * 4),
                             *(int *)((long)__s + (long)p->Nodes[iLit].Fanins[2] * 4));
      *(int *)((long)__s + (long)iLit * 4) = iVar2;
    }
    else {
      if (uVar3 != 6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x219,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      iVar2 = 1 << (sbyte)uVar4;
      if (8 < uVar4) {
        __assert_fail("nFans >= 0 && nFans <= 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x210,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
        (&local_458)[local_28] =
             *(int *)((long)__s + (long)(int)((uVar1 >> 8 & 0xff) + local_28) * 4);
      }
      pVarsData[0xff] = 1;
      for (local_28 = 0; local_28 < (int)uVar4; local_28 = local_28 + 1) {
        for (local_50 = 0; local_50 < iVar2; local_50 = pVarsData[0xff] * 2 + local_50) {
          iVar5 = Gia_ManHashMux(p_00,*(int *)((long)__s + (long)piVar7[local_28] * 4),
                                 (&local_458)[local_50 + pVarsData[0xff]],(&local_458)[local_50]);
          (&local_458)[local_50] = iVar5;
        }
        pVarsData[0xff] = pVarsData[0xff] << 1;
      }
      if (pVarsData[0xff] != iVar2) {
        __assert_fail("Step == nMints",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x216,"Gia_Man_t *Ifn_ManStrFindModel(Ifn_Ntk_t *)");
      }
      *(int *)((long)__s + (long)iLit * 4) = local_458;
    }
    iLit = iLit + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Ifn_ManStrFindModel( Ifn_Ntk_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    int i, k, iLit, * pVarMap = ABC_FALLOC( int, p->nParsVIni );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "model" );
    Gia_ManHashStart( pNew );
    for ( i = 0; i < p->nInps; i++ )
        pVarMap[i] = Gia_ManAppendCi(pNew);
    for ( i = p->nObjs; i < p->nParsVIni; i++ )
        pVarMap[i] = Gia_ManAppendCi(pNew);
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int Type = p->Nodes[i].Type;
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        int iFanin = p->Nodes[i].iFirst;
        if ( Type == IFN_DSD_AND )
        {
            iLit = 1;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashAnd( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_XOR )
        {
            iLit = 0;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashXor( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            pVarMap[i] = Gia_ManHashMux( pNew, pVarMap[pFans[0]], pVarMap[pFans[1]], pVarMap[pFans[2]] );
        }
        else if ( Type == IFN_DSD_PRIME )
        {
            int n, Step, pVarsData[256];
            int nMints = (1 << nFans);
            assert( nFans >= 0 && nFans <= 8 );
            for ( k = 0; k < nMints; k++ )
                pVarsData[k] = pVarMap[iFanin + k];
            for ( Step = 1, k = 0; k < nFans; k++, Step <<= 1 )
                for ( n = 0; n < nMints; n += Step << 1 )
                    pVarsData[n] = Gia_ManHashMux( pNew, pVarMap[pFans[k]], pVarsData[n+Step], pVarsData[n] );
            assert( Step == nMints );
            pVarMap[i] = pVarsData[0];
        }
        else assert( 0 );
    }
    Gia_ManAppendCo( pNew, pVarMap[p->nObjs-1] );
    ABC_FREE( pVarMap );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == p->nParsVIni - (p->nObjs - p->nInps) );
    assert( Gia_ManPoNum(pNew) == 1 );
    return pNew;
}